

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

uint __thiscall Assimp::XGLImporter::ResolveMaterialRef(XGLImporter *this,TempScope *scope)

{
  _Rb_tree_header *p_Var1;
  pointer ppaVar2;
  int iVar3;
  _Rb_tree_color _Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ulong uVar7;
  bool bVar8;
  string local_58;
  string local_38;
  
  GetElementName_abi_cxx11_(&local_38,this);
  iVar3 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar3 == 0) {
    ReadMaterial(this,scope);
    uVar7 = (ulong)((int)((ulong)((long)(scope->materials_linear).
                                        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(scope->materials_linear).
                                       super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
LAB_005cd504:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return (uint)uVar7;
  }
  _Var4 = ReadIndexFromText(this);
  p_Var6 = (scope->materials)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(scope->materials)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      bVar8 = p_Var6[1]._M_color < _Var4;
      if (!bVar8) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[bVar8];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var5[1]._M_color <= _Var4)) goto LAB_005cd49d;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"<matref> index out of range","");
  LogFunctions<Assimp::XGLImporter>::ThrowException(&local_58);
  p_Var5 = &p_Var1->_M_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_005cd49d:
  ppaVar2 = (scope->materials_linear).
            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)(scope->materials_linear).
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar2) >> 3);
  if (iVar3 != 0) {
    uVar7 = 0;
    do {
      if ((_Base_ptr)ppaVar2[uVar7] == p_Var5[1]._M_parent) goto LAB_005cd504;
      uVar7 = uVar7 + 1;
    } while (iVar3 != (int)uVar7);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/XGL/XGLLoader.cpp"
                ,0x2d9,"unsigned int Assimp::XGLImporter::ResolveMaterialRef(TempScope &)");
}

Assistant:

unsigned int XGLImporter::ResolveMaterialRef(TempScope& scope)
{
    const std::string& s = GetElementName();
    if (s == "mat") {
        ReadMaterial(scope);
        return static_cast<unsigned int>(scope.materials_linear.size()-1);
    }

    const int id = ReadIndexFromText();

    std::map<unsigned int, aiMaterial*>::iterator it = scope.materials.find(id), end = scope.materials.end();
    if (it == end) {
        ThrowException("<matref> index out of range");
    }

    // ok, this is n^2 and should get optimized one day
    aiMaterial* const m = (*it).second;

    unsigned int i = 0, mcount = static_cast<unsigned int>(scope.materials_linear.size());
    for(; i < mcount; ++i) {
        if (scope.materials_linear[i] == m) {
            return i;
        }
    }

    ai_assert(false);
    return 0;
}